

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_writer.h
# Opt level: O2

void __thiscall
cppwinrt::writer_base<cppwinrt::writer>::
write_segment<winmd::reader::TypeDef,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
          (writer_base<cppwinrt::writer> *this,string_view *value,TypeDef *first,
          basic_string_view<char,_std::char_traits<char>_> *rest,
          basic_string_view<char,_std::char_traits<char>_> *rest_1)

{
  byte bVar1;
  size_type __n;
  void *__buf;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  __n = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of(value,"^%@",0);
  if (__n == 0xffffffffffffffff) {
    __assert_fail("offset != std::string_view::npos",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/text_writer.h"
                  ,0x125,
                  "void cppwinrt::writer_base<cppwinrt::writer>::write_segment(const std::string_view &, const First &, const Rest &...) [T = cppwinrt::writer, First = winmd::reader::TypeDef, Rest = <std::basic_string_view<char>, std::basic_string_view<char>>]"
                 );
  }
  local_40 = std::basic_string_view<char,_std::char_traits<char>_>::substr(value,0,__n);
  write_impl(this,&local_40);
  bVar1 = value->_M_str[__n];
  if (bVar1 == 0x25) {
    writer::write((writer *)this,(int)first,__buf,(ulong)bVar1);
    local_40 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (value,__n + 1,0xffffffffffffffff);
    write_segment<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
              (this,&local_40,rest,rest_1);
  }
  else {
    if (bVar1 != 0x5e) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/text_writer.h"
                    ,0x13d,
                    "void cppwinrt::writer_base<cppwinrt::writer>::write_segment(const std::string_view &, const First &, const Rest &...) [T = cppwinrt::writer, First = winmd::reader::TypeDef, Rest = <std::basic_string_view<char>, std::basic_string_view<char>>]"
                   );
    }
    if (__n == value->_M_len - 1) {
      __assert_fail("offset != value.size() - 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/text_writer.h"
                    ,0x12a,
                    "void cppwinrt::writer_base<cppwinrt::writer>::write_segment(const std::string_view &, const First &, const Rest &...) [T = cppwinrt::writer, First = winmd::reader::TypeDef, Rest = <std::basic_string_view<char>, std::basic_string_view<char>>]"
                   );
    }
    write_impl(this,value->_M_str[__n + 1]);
    local_40 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (value,__n + 2,0xffffffffffffffff);
    write_segment<winmd::reader::TypeDef,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
              (this,&local_40,first,rest,rest_1);
  }
  return;
}

Assistant:

void write_segment(std::string_view const& value, First const& first, Rest const&... rest)
        {
            auto offset = value.find_first_of("^%@");
            assert(offset != std::string_view::npos);
            write(value.substr(0, offset));

            if (value[offset] == '^')
            {
                assert(offset != value.size() - 1);

                write(value[offset + 1]);
                write_segment(value.substr(offset + 2), first, rest...);
            }
            else
            {
                if (value[offset] == '%')
                {
                    static_cast<T*>(this)->write(first);
                }
                else
                {
                    if constexpr (std::is_convertible_v<First, std::string_view>)
                    {
                        static_cast<T*>(this)->write_code(first);
                    }
                    else
                    {
                        assert(false); // '@' placeholders are only for text.
                    }
                }

                write_segment(value.substr(offset + 1), rest...);
            }
        }